

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlSetUniformSampler(int locIndex,uint textureId)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    if (RLGL.State.activeTextureId[lVar1] == textureId) {
      (*glad_glUniform1i)(locIndex,(int)lVar1 + 1);
      return;
    }
  }
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 4) {
      return;
    }
    if (RLGL.State.activeTextureId[lVar1] == 0) break;
    lVar1 = lVar1 + 1;
  }
  (*glad_glUniform1i)(locIndex,(int)lVar1 + 1);
  RLGL.State.activeTextureId[lVar1] = textureId;
  return;
}

Assistant:

void rlSetUniformSampler(int locIndex, unsigned int textureId)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Check if texture is already active
    for (int i = 0; i < RL_DEFAULT_BATCH_MAX_TEXTURE_UNITS; i++)
    {
        if (RLGL.State.activeTextureId[i] == textureId)
        {
            glUniform1i(locIndex, 1 + i);
            return;
        }
    }

    // Register a new active texture for the internal batch system
    // NOTE: Default texture is always activated as GL_TEXTURE0
    for (int i = 0; i < RL_DEFAULT_BATCH_MAX_TEXTURE_UNITS; i++)
    {
        if (RLGL.State.activeTextureId[i] == 0)
        {
            glUniform1i(locIndex, 1 + i);              // Activate new texture unit
            RLGL.State.activeTextureId[i] = textureId; // Save texture id for binding on drawing
            break;
        }
    }
#endif
}